

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O3

void __thiscall ipx::ForrestTomlin::SolvePermuted(ForrestTomlin *this,Vector *lhs,char trans)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  double *pdVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer piVar8;
  bool bVar9;
  char *pcVar10;
  char trans_00;
  ulong uVar11;
  SparseMatrix *A;
  int iVar12;
  long lVar13;
  uint uVar14;
  double dVar15;
  
  piVar4 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = (uint)((ulong)((long)(this->replaced_).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar4) >> 2);
  if ((trans & 0xdfU) == 0x54) {
    if ((int)uVar14 < 1) {
      TriangularSolve(&this->U_,lhs,'t',"upper",0);
    }
    else {
      pdVar5 = lhs->_M_data;
      iVar12 = this->dim_;
      uVar11 = 0;
      do {
        iVar2 = piVar4[uVar11];
        pdVar5[(long)iVar12 + uVar11] = pdVar5[iVar2];
        pdVar5[iVar2] = 0.0;
        uVar11 = uVar11 + 1;
      } while ((uVar14 & 0x7fffffff) != uVar11);
      TriangularSolve(&this->U_,lhs,'t',"upper",0);
      if (0 < (int)uVar14) {
        iVar12 = this->dim_;
        pdVar5 = lhs->_M_data;
        piVar4 = (this->R_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar6 = (this->R_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar7 = (this->R_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar8 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = (ulong)(uVar14 & 0x7fffffff);
        do {
          uVar1 = uVar11 - 1;
          dVar15 = pdVar5[(long)iVar12 + (uVar11 - 1)];
          iVar2 = piVar4[uVar11 - 1];
          lVar13 = (long)iVar2;
          iVar3 = piVar4[uVar11];
          if (iVar2 < iVar3) {
            do {
              iVar2 = piVar6[lVar13];
              pdVar5[iVar2] = pdVar7[lVar13] * -dVar15 + pdVar5[iVar2];
              lVar13 = lVar13 + 1;
            } while (iVar3 != lVar13);
            dVar15 = pdVar5[(long)iVar12 + uVar1];
          }
          pdVar5[piVar8[uVar1]] = dVar15;
          pdVar5[(long)iVar12 + uVar1] = 0.0;
          bVar9 = 1 < (long)uVar11;
          uVar11 = uVar1;
        } while (bVar9);
      }
    }
    A = &this->L_;
    pcVar10 = "BTRAN lower";
    trans_00 = 't';
    iVar12 = 1;
  }
  else {
    TriangularSolve(&this->L_,lhs,'n',"lower",1);
    if (0 < (int)uVar14) {
      piVar4 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = lhs->_M_data;
      piVar6 = (this->R_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (this->R_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->R_).values_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar12 = this->dim_;
      uVar11 = 0;
      do {
        iVar2 = piVar6[uVar11];
        lVar13 = (long)iVar2;
        iVar3 = piVar6[uVar11 + 1];
        dVar15 = 0.0;
        if (iVar2 < iVar3) {
          do {
            dVar15 = dVar15 + pdVar5[piVar8[lVar13]] * pdVar7[lVar13];
            lVar13 = lVar13 + 1;
          } while (iVar3 != lVar13);
        }
        iVar2 = piVar4[uVar11];
        pdVar5[(long)iVar12 + uVar11] = pdVar5[iVar2] - dVar15;
        pdVar5[iVar2] = 0.0;
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uVar14 & 0x7fffffff));
      TriangularSolve(&this->U_,lhs,'n',"upper",0);
      if (0 < (int)uVar14) {
        iVar12 = this->dim_;
        pdVar5 = lhs->_M_data;
        piVar4 = (this->replaced_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = (ulong)(uVar14 & 0x7fffffff) + 1;
        do {
          pdVar5[piVar4[uVar11 - 2]] = pdVar5[(long)iVar12 + (uVar11 - 2)];
          pdVar5[(long)iVar12 + (uVar11 - 2)] = 0.0;
          uVar11 = uVar11 - 1;
        } while (1 < uVar11);
      }
      return;
    }
    A = &this->U_;
    pcVar10 = "BTRAN upper";
    trans_00 = 'n';
    iVar12 = 0;
  }
  TriangularSolve(A,lhs,trans_00,pcVar10 + 6,iVar12);
  return;
}

Assistant:

void ForrestTomlin::SolvePermuted(Vector& lhs, char trans) {
    Int num_updates = replaced_.size();
    assert(U_.cols() == dim_+num_updates);

    // Require num_updates elements workspace at end of lhs.
    assert((Int)lhs.size() >= dim_+num_updates);

    if (trans == 't' || trans == 'T') {
        // Move replaced entries to the end of the pivot sequence and zero out
        // their old position. Because the corresponding columns of U are unit
        // columns now, the replaced positions remain zero when solving with U'.
        // This is crucial because we neglected to zero out the corresponding
        // rows of U in the update, so there are entries in U which actually
        // should not be there.
        for (Int k = 0; k < num_updates; k++) {
            lhs[dim_+k] = lhs[replaced_[k]];
            lhs[replaced_[k]] = 0.0;
        }
        TriangularSolve(U_, lhs, 't', "upper", 0);
        // Solve backwards with row eta matrices (leading scatter operations)
        // and put the entry from the end of the pivot sequence back into the
        // position that its update replaced.
        for (Int k = num_updates-1; k >= 0; k--) {
            ScatterColumn(R_, k, -lhs[dim_+k], lhs);
            lhs[replaced_[k]] = lhs[dim_+k];
            lhs[dim_+k] = 0.0;
        }
        TriangularSolve(L_, lhs, 't', "lower", 1);
    }
    else {
        TriangularSolve(L_, lhs, 'n', "lower", 1);
        // Solve forward with row eta matrices (leading gather operations) and
        // put the newly computed entry at the end of the pivot sequence. We
        // actually would not need to zero out the replaced positions here
        // because they will not be accessed by any subsequent eta matrix.
        for (Int k = 0; k < num_updates; k++) {
            lhs[dim_+k] = lhs[replaced_[k]] - DotColumn(R_, k, lhs);
            lhs[replaced_[k]] = 0.0;
        }
        // The triangular solve with U fills the replaced position with garbage.
        // This does not hurt because by the fact that the corresponding columns
        // of U have no nonzero off-diagonal entries, the computed values are
        // not propagated further. We finally overwrite them with their actual
        // values from the end of the pivot sequence.
        TriangularSolve(U_, lhs, 'n', "upper", 0);
        for (Int k = num_updates-1; k >= 0; k--) {
            lhs[replaced_[k]] = lhs[dim_+k];
            lhs[dim_+k] = 0.0;
        }
    }
}